

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O0

void __thiscall Game::Game(Game *this,vector<Player,_std::allocator<Player>_> *players)

{
  allocator<int> local_41;
  vector<int,_std::allocator<int>_> local_40;
  vector<Player,_std::allocator<Player>_> *local_18;
  vector<Player,_std::allocator<Player>_> *players_local;
  Game *this_local;
  
  local_18 = players;
  players_local = &this->m_players;
  std::vector<Player,_std::allocator<Player>_>::vector(&this->m_players,players);
  std::vector<Card,_std::allocator<Card>_>::vector(&this->m_allCards);
  std::
  vector<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
  ::vector(&this->m_playerCards);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_playerPoints);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->m_teams);
  Ruleset::Ruleset(&this->m_rules);
  initializeCards(this);
  std::allocator<int>::allocator(&local_41);
  std::vector<int,_std::allocator<int>_>::vector(&local_40,4,&local_41);
  std::vector<int,_std::allocator<int>_>::operator=(&this->m_playerPoints,&local_40);
  std::vector<int,_std::allocator<int>_>::~vector(&local_40);
  std::allocator<int>::~allocator(&local_41);
  return;
}

Assistant:

explicit Game(std::vector<Player> &players) : m_players(players) {
        initializeCards();
        m_playerPoints = std::vector<int>(4);
    }